

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LocalAccessChainConvertPass::AllExtensionsSupported
          (LocalAccessChainConvertPass *this)

{
  IRContext *this_00;
  Module *pMVar1;
  bool bVar2;
  int iVar3;
  Operand *pOVar4;
  const_iterator cVar5;
  Instruction *pIVar6;
  Instruction *ei;
  Instruction *pIVar7;
  string extName;
  string local_50;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  if ((this_00->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
      (FeatureManager *)0x0) {
    IRContext::AnalyzeFeatures(this_00);
  }
  bVar2 = EnumSet<spv::Capability>::contains
                    (&((this_00->feature_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                       .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)
                      ->capabilities_,CapabilityVariablePointers);
  if (bVar2) {
LAB_005e16ec:
    bVar2 = false;
  }
  else {
    pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    pIVar7 = *(Instruction **)
              ((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    pIVar6 = (Instruction *)
             ((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
    bVar2 = pIVar7 == pIVar6;
    if (!bVar2) {
      do {
        pOVar4 = Instruction::GetInOperand(pIVar7,0);
        Operand::AsString_abi_cxx11_(&local_50,pOVar4);
        cVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&(this->extensions_allowlist_)._M_h,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (cVar5.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (!bVar2) goto LAB_005e16ec;
          break;
        }
        pIVar7 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        bVar2 = pIVar7 == pIVar6;
      } while (!bVar2);
    }
    pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    pIVar7 = *(Instruction **)
              ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> +
              0x10);
    pIVar6 = (Instruction *)
             ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 8
             );
    bVar2 = pIVar7 == pIVar6;
    if (!bVar2) {
      do {
        if (pIVar7->opcode_ != OpExtInstImport) {
          __assert_fail("inst.opcode() == spv::Op::OpExtInstImport && \"Expecting an import of an extension\'s instruction set.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/local_access_chain_convert_pass.cpp"
                        ,0x16a,
                        "bool spvtools::opt::LocalAccessChainConvertPass::AllExtensionsSupported() const"
                       );
        }
        pOVar4 = Instruction::GetInOperand(pIVar7,0);
        Operand::AsString_abi_cxx11_(&local_50,pOVar4);
        iVar3 = std::__cxx11::string::compare((ulong)&local_50,0,(char *)0xc);
        if ((iVar3 == 0) && (iVar3 = std::__cxx11::string::compare((char *)&local_50), iVar3 != 0))
        {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == &local_50.field_2) {
            return bVar2;
          }
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          return bVar2;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pIVar7 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        bVar2 = pIVar7 == pIVar6;
      } while (!bVar2);
    }
  }
  return bVar2;
}

Assistant:

bool LocalAccessChainConvertPass::AllExtensionsSupported() const {
  // This capability can now exist without the extension, so we have to check
  // for the capability.  This pass is only looking at function scope symbols,
  // so we do not care if there are variable pointers on storage buffers.
  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::VariablePointers))
    return false;
  // If any extension not in allowlist, return false
  for (auto& ei : get_module()->extensions()) {
    const std::string extName = ei.GetInOperand(0).AsString();
    if (extensions_allowlist_.find(extName) == extensions_allowlist_.end())
      return false;
  }
  // only allow NonSemantic.Shader.DebugInfo.100, we cannot safely optimise
  // around unknown extended
  // instruction sets even if they are non-semantic
  for (auto& inst : context()->module()->ext_inst_imports()) {
    assert(inst.opcode() == spv::Op::OpExtInstImport &&
           "Expecting an import of an extension's instruction set.");
    const std::string extension_name = inst.GetInOperand(0).AsString();
    if (spvtools::utils::starts_with(extension_name, "NonSemantic.") &&
        extension_name != "NonSemantic.Shader.DebugInfo.100") {
      return false;
    }
  }
  return true;
}